

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDeviceTypeClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDeviceTypeClause *this)

{
  long lVar1;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPDeviceTypeClauseKind local_54;
  undefined1 local_50 [4];
  OpenMPDeviceTypeClauseKind device_type_kind;
  string parameter_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPDeviceTypeClause *local_18;
  OpenMPDeviceTypeClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPDeviceTypeClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"device_type (",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)local_50);
  local_54 = getDeviceTypeClauseKind(this);
  if (local_54 == OMPC_DEVICE_TYPE_host) {
    std::__cxx11::string::operator=((string *)local_50,"host");
  }
  else if (local_54 == OMPC_DEVICE_TYPE_nohost) {
    std::__cxx11::string::operator=((string *)local_50,"nohost");
  }
  else if (local_54 == OMPC_DEVICE_TYPE_any) {
    std::__cxx11::string::operator=((string *)local_50,"any");
  }
  else {
    std::operator<<((ostream *)&std::cout,"The parameter of device_type clause is not supported.\n")
    ;
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   ") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDeviceTypeClause::toString() {

    std::string result = "device_type (";
    std::string parameter_string;
    OpenMPDeviceTypeClauseKind device_type_kind = this->getDeviceTypeClauseKind();
    switch (device_type_kind) {
        case OMPC_DEVICE_TYPE_host:
            parameter_string = "host";
            break;
        case OMPC_DEVICE_TYPE_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_DEVICE_TYPE_any:
            parameter_string = "any";
            break;
        default:
            std::cout << "The parameter of device_type clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}